

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint readChunk_sBIT(LodePNGInfo *info,uchar *data,size_t chunkLength)

{
  byte bVar1;
  LodePNGColorType LVar2;
  uint uVar3;
  
  LVar2 = (info->color).colortype;
  uVar3 = 8;
  if (LVar2 != LCT_PALETTE) {
    uVar3 = (info->color).bitdepth;
  }
  switch(LVar2) {
  case LCT_GREY:
    if (chunkLength != 1) {
      return 0x72;
    }
    if (uVar3 < *data || *data == 0) {
      return 0x73;
    }
    info->sbit_defined = 1;
    bVar1 = *data;
    info->sbit_b = (uint)bVar1;
    info->sbit_g = (uint)bVar1;
    info->sbit_r = (uint)bVar1;
    break;
  case LCT_RGB:
  case LCT_PALETTE:
    if (chunkLength != 3) {
      return 0x72;
    }
    if (*data == 0) {
      return 0x73;
    }
    if (data[1] == 0) {
      return 0x73;
    }
    if (data[2] == 0) {
      return 0x73;
    }
    if (uVar3 < data[2] || (uVar3 < data[1] || uVar3 < *data)) {
      return 0x73;
    }
    info->sbit_defined = 1;
    info->sbit_r = (uint)*data;
    info->sbit_g = (uint)data[1];
    info->sbit_b = (uint)data[2];
    break;
  case LCT_GREY_ALPHA:
    if (chunkLength != 2) {
      return 0x72;
    }
    if (*data == 0) {
      return 0x73;
    }
    if (data[1] == 0) {
      return 0x73;
    }
    if (uVar3 < data[1] || uVar3 < *data) {
      return 0x73;
    }
    info->sbit_defined = 1;
    bVar1 = *data;
    info->sbit_b = (uint)bVar1;
    info->sbit_g = (uint)bVar1;
    info->sbit_r = (uint)bVar1;
    bVar1 = data[1];
    goto LAB_001e521d;
  case LCT_RGBA:
    if (chunkLength != 4) {
      return 0x72;
    }
    if (*data == 0) {
      return 0x73;
    }
    if (data[1] == 0) {
      return 0x73;
    }
    if (data[2] == 0) {
      return 0x73;
    }
    if (data[3] == 0) {
      return 0x73;
    }
    if ((uVar3 < data[3] || uVar3 < data[2]) || (uVar3 < data[1] || uVar3 < *data)) {
      return 0x73;
    }
    info->sbit_defined = 1;
    info->sbit_r = (uint)*data;
    info->sbit_g = (uint)data[1];
    info->sbit_b = (uint)data[2];
    bVar1 = data[3];
LAB_001e521d:
    info->sbit_a = (uint)bVar1;
  }
  return 0;
}

Assistant:

static unsigned readChunk_sBIT(LodePNGInfo* info, const unsigned char* data, size_t chunkLength) {
  unsigned bitdepth = (info->color.colortype == LCT_PALETTE) ? 8 : info->color.bitdepth;
  if(info->color.colortype == LCT_GREY) {
    /*error: this chunk must be 1 bytes for grayscale image*/
    if(chunkLength != 1) return 114;
    if(data[0] == 0 || data[0] > bitdepth) return 115;
    info->sbit_defined = 1;
    info->sbit_r = info->sbit_g = info->sbit_b = data[0]; /*setting g and b is not required, but sensible*/
  } else if(info->color.colortype == LCT_RGB || info->color.colortype == LCT_PALETTE) {
    /*error: this chunk must be 3 bytes for RGB and palette image*/
    if(chunkLength != 3) return 114;
    if(data[0] == 0 || data[1] == 0 || data[2] == 0) return 115;
    if(data[0] > bitdepth || data[1] > bitdepth || data[2] > bitdepth) return 115;
    info->sbit_defined = 1;
    info->sbit_r = data[0];
    info->sbit_g = data[1];
    info->sbit_b = data[2];
  } else if(info->color.colortype == LCT_GREY_ALPHA) {
    /*error: this chunk must be 2 byte for grayscale with alpha image*/
    if(chunkLength != 2) return 114;
    if(data[0] == 0 || data[1] == 0) return 115;
    if(data[0] > bitdepth || data[1] > bitdepth) return 115;
    info->sbit_defined = 1;
    info->sbit_r = info->sbit_g = info->sbit_b = data[0]; /*setting g and b is not required, but sensible*/
    info->sbit_a = data[1];
  } else if(info->color.colortype == LCT_RGBA) {
    /*error: this chunk must be 4 bytes for grayscale image*/
    if(chunkLength != 4) return 114;
    if(data[0] == 0 || data[1] == 0 || data[2] == 0 || data[3] == 0) return 115;
    if(data[0] > bitdepth || data[1] > bitdepth || data[2] > bitdepth || data[3] > bitdepth) return 115;
    info->sbit_defined = 1;
    info->sbit_r = data[0];
    info->sbit_g = data[1];
    info->sbit_b = data[2];
    info->sbit_a = data[3];
  }

  return 0; /* OK */
}